

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Create.hpp
# Opt level: O0

Gen<char> * rc::gen::just<char>(Gen<char> *__return_storage_ptr__,char *value)

{
  Shrinkable<char> local_28;
  Constant<rc::Shrinkable<char>_> local_20;
  char *local_18;
  char *value_local;
  
  local_18 = value;
  value_local = (char *)__return_storage_ptr__;
  rc::shrinkable::just<char>((shrinkable *)&local_28,value);
  fn::constant<rc::Shrinkable<char>>((fn *)&local_20,&local_28);
  Gen<char>::Gen<rc::fn::Constant<rc::Shrinkable<char>>,void>(__return_storage_ptr__,&local_20);
  fn::Constant<rc::Shrinkable<char>_>::~Constant(&local_20);
  Shrinkable<char>::~Shrinkable(&local_28);
  return __return_storage_ptr__;
}

Assistant:

Gen<Decay<T>> just(T &&value) {
  return fn::constant(shrinkable::just(std::forward<T>(value)));
}